

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# navigationbutton.cpp
# Opt level: O0

QSize __thiscall QtMWidgets::NavigationButton::sizeHint(NavigationButton *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int local_a0;
  QSize local_74;
  QSize local_6c;
  QSize local_64 [2];
  QString local_50;
  QWidget local_38 [8];
  QRect local_30;
  QRect *local_20;
  QRect *b;
  NavigationButton *this_local;
  
  b = (QRect *)this;
  QWidget::fontMetrics(local_38);
  QAbstractButton::text();
  local_30 = (QRect)QFontMetrics::boundingRect((QString *)local_38);
  QString::~QString(&local_50);
  QFontMetrics::~QFontMetrics((QFontMetrics *)local_38);
  local_20 = &local_30;
  local_64[0] = (QSize)(**(code **)(*(long *)this + 0x78))();
  iVar1 = QSize::width(local_64);
  iVar2 = QRect::width(local_20);
  local_6c = (QSize)(**(code **)(*(long *)this + 0x78))();
  iVar3 = QSize::height(&local_6c);
  iVar4 = QRect::height(local_20);
  if (iVar4 < iVar3) {
    local_74 = (QSize)(**(code **)(*(long *)this + 0x78))();
    local_a0 = QSize::height(&local_74);
  }
  else {
    local_a0 = QRect::height(local_20);
  }
  QSize::QSize((QSize *)&this_local,iVar1 + iVar2 + 0x14,local_a0);
  return (QSize)this_local;
}

Assistant:

QSize
NavigationButton::sizeHint() const
{
	const QRect & b = fontMetrics().boundingRect( text() );

	return QSize( minimumSizeHint().width() + b.width() + c_offset * 2,
		( minimumSizeHint().height() > b.height() ?
			minimumSizeHint().height() : b.height() ) );
}